

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_initCStream_usingDict(ZSTD_CStream *zcs,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  long lVar2;
  ZSTD_CCtx_params *pZVar3;
  undefined8 *puVar4;
  ZSTD_CCtx_params in_stack_ffffffffffffff78;
  
  (zcs->requestedParams).fParams.contentSizeFlag = 0;
  (zcs->requestedParams).fParams.checksumFlag = 0;
  *(undefined8 *)&(zcs->requestedParams).fParams.noDictIDFlag = 0;
  (zcs->requestedParams).customMem.customFree = (ZSTD_freeFunction)0x0;
  (zcs->requestedParams).customMem.opaque = (void *)0x0;
  (zcs->requestedParams).ldmParams.hashRateLog = 0;
  (zcs->requestedParams).ldmParams.windowLog = 0;
  (zcs->requestedParams).customMem.customAlloc = (ZSTD_allocFunction)0x0;
  (zcs->requestedParams).ldmParams.enableLdm = 0;
  (zcs->requestedParams).ldmParams.hashLog = 0;
  (zcs->requestedParams).ldmParams.bucketSizeLog = 0;
  (zcs->requestedParams).ldmParams.minMatchLength = 0;
  (zcs->requestedParams).jobSize = 0;
  (zcs->requestedParams).overlapLog = 0;
  (zcs->requestedParams).rsyncable = 0;
  (zcs->requestedParams).forceWindow = 0;
  (zcs->requestedParams).attachDictPref = ZSTD_dictDefaultAttach;
  *(undefined8 *)&(zcs->requestedParams).nbWorkers = 0;
  (zcs->requestedParams).cParams.searchLog = 0;
  (zcs->requestedParams).cParams.minMatch = 0;
  (zcs->requestedParams).cParams.targetLength = 0;
  (zcs->requestedParams).cParams.strategy = 0;
  (zcs->requestedParams).format = ZSTD_f_zstd1;
  (zcs->requestedParams).cParams.windowLog = 0;
  (zcs->requestedParams).cParams.chainLog = 0;
  (zcs->requestedParams).cParams.hashLog = 0;
  (zcs->requestedParams).compressionLevel = compressionLevel;
  (zcs->requestedParams).fParams.contentSizeFlag = 1;
  pZVar3 = &zcs->requestedParams;
  puVar4 = (undefined8 *)&stack0xffffffffffffff78;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pZVar3;
    pZVar3 = (ZSTD_CCtx_params *)&(pZVar3->cParams).chainLog;
    puVar4 = puVar4 + 1;
  }
  sVar1 = ZSTD_initCStream_internal
                    (zcs,dict,dictSize,(ZSTD_CDict *)0x0,in_stack_ffffffffffffff78,
                     0xffffffffffffffff);
  return sVar1;
}

Assistant:

size_t ZSTD_initCStream_usingDict(ZSTD_CStream* zcs, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_CCtxParams_init(&zcs->requestedParams, compressionLevel);
    return ZSTD_initCStream_internal(zcs, dict, dictSize, NULL, zcs->requestedParams, ZSTD_CONTENTSIZE_UNKNOWN);
}